

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::Expression::
visitExpression<slang::ast::Expression_const,slang::ast::builtins::MonitorVisitor&>
          (Expression *this,Expression *expr,MonitorVisitor *visitor)

{
  logic_error *this_00;
  string local_f8;
  allocator<char> local_c1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  MonitorVisitor *local_20;
  MonitorVisitor *visitor_local;
  Expression *expr_local;
  Expression *this_local;
  
  local_20 = visitor;
  visitor_local = (MonitorVisitor *)expr;
  expr_local = this;
  switch(expr->kind) {
  case Invalid:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::visitInvalid
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,expr);
    break;
  case IntegerLiteral:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::visit<slang::ast::IntegerLiteral>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (IntegerLiteral *)expr);
    break;
  case RealLiteral:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::visit<slang::ast::RealLiteral>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (RealLiteral *)expr);
    break;
  case TimeLiteral:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::visit<slang::ast::TimeLiteral>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (TimeLiteral *)expr);
    break;
  case UnbasedUnsizedIntegerLiteral:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::UnbasedUnsizedIntegerLiteral>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (UnbasedUnsizedIntegerLiteral *)expr);
    break;
  case NullLiteral:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::visit<slang::ast::NullLiteral>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (NullLiteral *)expr);
    break;
  case UnboundedLiteral:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::UnboundedLiteral>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (UnboundedLiteral *)expr);
    break;
  case StringLiteral:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::visit<slang::ast::StringLiteral>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (StringLiteral *)expr);
    break;
  case NamedValue:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::NamedValueExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (NamedValueExpression *)expr);
    break;
  case HierarchicalValue:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::HierarchicalValueExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (HierarchicalValueExpression *)expr);
    break;
  case UnaryOp:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::visit<slang::ast::UnaryExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (UnaryExpression *)expr);
    break;
  case BinaryOp:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::BinaryExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (BinaryExpression *)expr);
    break;
  case ConditionalOp:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::ConditionalExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (ConditionalExpression *)expr);
    break;
  case Inside:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::InsideExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (InsideExpression *)expr);
    break;
  case Assignment:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::AssignmentExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (AssignmentExpression *)expr);
    break;
  case Concatenation:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::ConcatenationExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (ConcatenationExpression *)expr);
    break;
  case Replication:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::ReplicationExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (ReplicationExpression *)expr);
    break;
  case Streaming:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::StreamingConcatenationExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (StreamingConcatenationExpression *)expr);
    break;
  case ElementSelect:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::ElementSelectExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (ElementSelectExpression *)expr);
    break;
  case RangeSelect:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::RangeSelectExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (RangeSelectExpression *)expr);
    break;
  case MemberAccess:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::MemberAccessExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (MemberAccessExpression *)expr);
    break;
  case Call:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::visit<slang::ast::CallExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (CallExpression *)expr);
    break;
  case Conversion:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::ConversionExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (ConversionExpression *)expr);
    break;
  case DataType:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::DataTypeExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (DataTypeExpression *)expr);
    break;
  case TypeReference:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::TypeReferenceExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (TypeReferenceExpression *)expr);
    break;
  case HierarchicalReference:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::HierarchicalReferenceExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (HierarchicalReferenceExpression *)expr);
    break;
  case LValueReference:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::LValueReferenceExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (LValueReferenceExpression *)expr);
    break;
  case SimpleAssignmentPattern:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::SimpleAssignmentPatternExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (SimpleAssignmentPatternExpression *)expr);
    break;
  case StructuredAssignmentPattern:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::StructuredAssignmentPatternExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (StructuredAssignmentPatternExpression *)expr);
    break;
  case ReplicatedAssignmentPattern:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::ReplicatedAssignmentPatternExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (ReplicatedAssignmentPatternExpression *)expr);
    break;
  case EmptyArgument:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::EmptyArgumentExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (EmptyArgumentExpression *)expr);
    break;
  case OpenRange:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::OpenRangeExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (OpenRangeExpression *)expr);
    break;
  case Dist:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::visit<slang::ast::DistExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (DistExpression *)expr);
    break;
  case NewArray:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::NewArrayExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (NewArrayExpression *)expr);
    break;
  case NewClass:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::NewClassExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (NewClassExpression *)expr);
    break;
  case NewCovergroup:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::NewCovergroupExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (NewCovergroupExpression *)expr);
    break;
  case CopyClass:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::CopyClassExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (CopyClassExpression *)expr);
    break;
  case MinTypMax:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::MinTypMaxExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (MinTypMaxExpression *)expr);
    break;
  case ClockingEvent:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::ClockingEventExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (ClockingEventExpression *)expr);
    break;
  case AssertionInstance:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::AssertionInstanceExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (AssertionInstanceExpression *)expr);
    break;
  case TaggedUnion:
    ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true>::
    visit<slang::ast::TaggedUnionExpression>
              ((ASTVisitor<slang::ast::builtins::MonitorVisitor,_true,_true> *)visitor,
               (TaggedUnionExpression *)expr);
    break;
  default:
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/ast/ASTVisitor.h"
               ,&local_c1);
    std::operator+(&local_a0,&local_c0,":");
    std::__cxx11::to_string(&local_f8,0x15b);
    std::operator+(&local_80,&local_a0,&local_f8);
    std::operator+(&local_60,&local_80,": ");
    std::operator+(&local_40,&local_60,"Default case should be unreachable!");
    std::logic_error::logic_error(this_00,(string *)&local_40);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  return;
}

Assistant:

decltype(auto) Expression::visitExpression(TExpression* expr, TVisitor&& visitor,
                                           Args&&... args) const {
    // clang-format off
#define CASE(k, n) case ExpressionKind::k: return visitor.visit(\
                        *static_cast<std::conditional_t<std::is_const_v<TExpression>, const n*, n*>>(expr),\
                            std::forward<Args>(args)...)

    switch (expr->kind) {
        case ExpressionKind::Invalid: return visitor.visitInvalid(*expr, std::forward<Args>(args)...);
        CASE(IntegerLiteral, IntegerLiteral);
        CASE(RealLiteral, RealLiteral);
        CASE(TimeLiteral, TimeLiteral);
        CASE(UnbasedUnsizedIntegerLiteral, UnbasedUnsizedIntegerLiteral);
        CASE(NullLiteral, NullLiteral);
        CASE(UnboundedLiteral, UnboundedLiteral);
        CASE(StringLiteral, StringLiteral);
        CASE(NamedValue, NamedValueExpression);
        CASE(HierarchicalValue, HierarchicalValueExpression);
        CASE(UnaryOp, UnaryExpression);
        CASE(BinaryOp, BinaryExpression);
        CASE(ConditionalOp, ConditionalExpression);
        CASE(Inside, InsideExpression);
        CASE(Assignment, AssignmentExpression);
        CASE(Concatenation, ConcatenationExpression);
        CASE(Replication, ReplicationExpression);
        CASE(Streaming, StreamingConcatenationExpression);
        CASE(ElementSelect, ElementSelectExpression);
        CASE(RangeSelect, RangeSelectExpression);
        CASE(MemberAccess, MemberAccessExpression);
        CASE(Call, CallExpression);
        CASE(Conversion, ConversionExpression);
        CASE(DataType, DataTypeExpression);
        CASE(TypeReference, TypeReferenceExpression);
        CASE(HierarchicalReference, HierarchicalReferenceExpression);
        CASE(LValueReference, LValueReferenceExpression);
        CASE(SimpleAssignmentPattern, SimpleAssignmentPatternExpression);
        CASE(StructuredAssignmentPattern, StructuredAssignmentPatternExpression);
        CASE(ReplicatedAssignmentPattern, ReplicatedAssignmentPatternExpression);
        CASE(EmptyArgument, EmptyArgumentExpression);
        CASE(OpenRange, OpenRangeExpression);
        CASE(Dist, DistExpression);
        CASE(NewArray, NewArrayExpression);
        CASE(NewClass, NewClassExpression);
        CASE(NewCovergroup, NewCovergroupExpression);
        CASE(CopyClass, CopyClassExpression);
        CASE(MinTypMax, MinTypMaxExpression);
        CASE(ClockingEvent, ClockingEventExpression);
        CASE(AssertionInstance, AssertionInstanceExpression);
        CASE(TaggedUnion, TaggedUnionExpression);
    }
#undef CASE
    // clang-format on
    ASSUME_UNREACHABLE;
}